

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O1

bool Diligent::IsDynamicBuffer(Resource *Res)

{
  BufferViewVkImpl *pBVar1;
  BufferVkImpl *pSrcPtr;
  uint uVar2;
  bool bVar3;
  string msg;
  string local_38;
  
  if ((Res->pObject).m_pObject != (IDeviceObject *)0x0) {
    uVar2 = Res->Type - 9;
    if (uVar2 < 4) {
      pBVar1 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                         (&Res->pObject);
      pSrcPtr = (BufferVkImpl *)
                (pBVar1->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_pBuffer;
      if (pSrcPtr != (BufferVkImpl *)0x0) {
        CheckDynamicType<Diligent::BufferVkImpl_const,Diligent::IBuffer>((IBuffer *)pSrcPtr);
      }
    }
    else if (Res->Type - 7 < 2) {
      pSrcPtr = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferVkImpl>
                          (&Res->pObject);
    }
    else {
      if (Res->BufferRangeSize != 0) {
        FormatString<char[26],char[25]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Res.BufferRangeSize == 0",(char (*) [25])(ulong)uVar2);
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"IsDynamicBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x8f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      pSrcPtr = (BufferVkImpl *)0x0;
    }
    if (pSrcPtr != (BufferVkImpl *)0x0) {
      bVar3 = (pSrcPtr->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc.Usage == USAGE_DYNAMIC;
      if (!bVar3) {
        bVar3 = false;
        if ((Res->Type < 0xd) && ((0x1900U >> (Res->Type & 0x1f) & 1) != 0)) {
          if (Res->BufferRangeSize == 0) {
            bVar3 = false;
          }
          else {
            bVar3 = Res->BufferRangeSize <
                    (pSrcPtr->super_BufferBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    .m_Desc.Size;
          }
        }
      }
      if (!bVar3) {
        return bVar3;
      }
      if ((Res->Type < 0xd) && ((0x1900U >> (Res->Type & 0x1f) & 1) != 0)) {
        return bVar3;
      }
      FormatString<char[63]>
                (&local_38,
                 (char (*) [63])"Dynamic buffers must only be used with dynamic descriptor type");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"IsDynamicBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0xa1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return bVar3;
      }
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      return bVar3;
    }
  }
  return false;
}

Assistant:

void ShaderResourceCacheVk::Resource::SetUniformBuffer(RefCntAutoPtr<IDeviceObject>&& _pBuffer, Uint64 _BaseOffset, Uint64 _RangeSize)
{
    VERIFY_EXPR(Type == DescriptorType::UniformBuffer ||
                Type == DescriptorType::UniformBufferDynamic);

    pObject = std::move(_pBuffer);

    const BufferVkImpl* pBuffVk = pObject.ConstPtr<BufferVkImpl>();

#ifdef DILIGENT_DEBUG
    if (pBuffVk != nullptr)
    {
        // VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER or VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC descriptor type require
        // buffer to be created with VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT
        VERIFY_EXPR((pBuffVk->GetDesc().BindFlags & BIND_UNIFORM_BUFFER) != 0);
        VERIFY(Type == DescriptorType::UniformBufferDynamic || pBuffVk->GetDesc().Usage != USAGE_DYNAMIC,
               "Dynamic buffer must be used with UniformBufferDynamic descriptor");
    }
#endif

    VERIFY(_BaseOffset + _RangeSize <= (pBuffVk != nullptr ? pBuffVk->GetDesc().Size : 0), "Specified range is out of buffer bounds");
    BufferBaseOffset = _BaseOffset;
    BufferRangeSize  = _RangeSize;
    if (BufferRangeSize == 0)
        BufferRangeSize = pBuffVk != nullptr ? (pBuffVk->GetDesc().Size - BufferBaseOffset) : 0;

    // Reset dynamic offset
    BufferDynamicOffset = 0;
}